

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Chapter::Display::Clear(Display *this)

{
  char **dst;
  
  if (this->title_ != (char *)0x0) {
    operator_delete__(this->title_);
  }
  this->title_ = (char *)0x0;
  if (this->language_ != (char *)0x0) {
    operator_delete__(this->language_);
  }
  this->language_ = (char *)0x0;
  if (this->country_ != (char *)0x0) {
    operator_delete__(this->country_);
  }
  this->country_ = (char *)0x0;
  return;
}

Assistant:

void Chapter::Display::Clear() {
  StrCpy(NULL, &title_);
  StrCpy(NULL, &language_);
  StrCpy(NULL, &country_);
}